

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall
wallet::LegacyDataSPKM::LoadKeyMetadata(LegacyDataSPKM *this,CKeyID *keyID,CKeyMetadata *meta)

{
  int64_t iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  mapped_type *pmVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  pmVar4 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](&this->mapKeyMetadata,keyID);
  uVar3 = *(undefined4 *)&meta->field_0x4;
  iVar1 = meta->nCreateTime;
  pmVar4->nVersion = meta->nVersion;
  *(undefined4 *)&pmVar4->field_0x4 = uVar3;
  pmVar4->nCreateTime = iVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pmVar4->hdKeypath,&meta->hdKeypath);
  *(undefined4 *)((pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
       *(undefined4 *)
        ((meta->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
  uVar2 = *(undefined8 *)
           ((meta->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
  *(undefined8 *)(pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems =
       *(undefined8 *)(meta->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems;
  *(undefined8 *)((pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8) =
       uVar2;
  *(undefined4 *)(pmVar4->key_origin).fingerprint = *(undefined4 *)(meta->key_origin).fingerprint;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(pmVar4->key_origin).path,&(meta->key_origin).path);
  pmVar4->has_key_origin = meta->has_key_origin;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyDataSPKM::LoadKeyMetadata(const CKeyID& keyID, const CKeyMetadata& meta)
{
    LOCK(cs_KeyStore);
    mapKeyMetadata[keyID] = meta;
}